

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.hpp
# Opt level: O2

state_type __thiscall
estl::state_machine<cdplayer>::next_state
          (state_machine<cdplayer> *this,state_type state,inputs_type *inputs)

{
  state_type sVar1;
  undefined8 *puVar2;
  switch_state_fun fn;
  
  std::function<cdplayer::state_type(cdplayer::inputs_type_const&)>::
  function<estl::state_machine<cdplayer>::switch_entry_const&,void>
            ((function<cdplayer::state_type(cdplayer::inputs_type_const&)> *)&fn,
             (this->state_switches_)._M_elems + state);
  if (fn.super__Function_base._M_manager != (_Manager_type)0x0) {
    sVar1 = std::function<cdplayer::state_type_(const_cdplayer::inputs_type_&)>::operator()
                      (&fn,inputs);
    std::_Function_base::~_Function_base(&fn.super__Function_base);
    return sVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00107d98;
  __cxa_throw(puVar2,&state_not_found::typeinfo,std::exception::~exception);
}

Assistant:

state_type next_state(state_type state, const inputs_type& inputs) const {
        const auto fn = get_switch_state_function(state);
        if (!fn) {
            throw state_not_found{};
        }
        return fn(inputs);
    }